

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3HexToBlob(sqlite3 *db,char *z,int n)

{
  u8 uVar1;
  byte bVar2;
  void *pvVar3;
  int local_2c;
  int i;
  char *zBlob;
  int n_local;
  char *z_local;
  sqlite3 *db_local;
  
  pvVar3 = sqlite3DbMallocRawNN(db,(long)(n / 2 + 1));
  if (pvVar3 != (void *)0x0) {
    for (local_2c = 0; local_2c < n + -1; local_2c = local_2c + 2) {
      uVar1 = sqlite3HexToInt((int)z[local_2c]);
      bVar2 = sqlite3HexToInt((int)z[local_2c + 1]);
      *(byte *)((long)pvVar3 + (long)(local_2c / 2)) = uVar1 << 4 | bVar2;
    }
    *(undefined1 *)((long)pvVar3 + (long)(local_2c / 2)) = 0;
  }
  return pvVar3;
}

Assistant:

SQLITE_PRIVATE void *sqlite3HexToBlob(sqlite3 *db, const char *z, int n){
  char *zBlob;
  int i;

  zBlob = (char *)sqlite3DbMallocRawNN(db, n/2 + 1);
  n--;
  if( zBlob ){
    for(i=0; i<n; i+=2){
      zBlob[i/2] = (sqlite3HexToInt(z[i])<<4) | sqlite3HexToInt(z[i+1]);
    }
    zBlob[i/2] = 0;
  }
  return zBlob;
}